

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::OnIfExcept
          (TypeChecker *this,TypeVector *param_types,TypeVector *result_types,TypeVector *except_sig
          )

{
  Result RVar1;
  Result RVar2;
  
  RVar1 = PopAndCheck1Type(this,ExceptRef,"if_except");
  RVar2 = PopAndCheckSignature(this,param_types,"if_except");
  PushLabel(this,IfExcept,param_types,result_types);
  PushTypes(this,param_types);
  PushTypes(this,except_sig);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::OnIfExcept(const TypeVector& param_types,
                               const TypeVector& result_types,
                               const TypeVector& except_sig) {
  Result result = PopAndCheck1Type(Type::ExceptRef, "if_except");
  result |= PopAndCheckSignature(param_types, "if_except");
  PushLabel(LabelType::IfExcept, param_types, result_types);
  // TODO(binji): Not quite sure how multi-value and exception proposals are
  // meant to interact here.
  PushTypes(param_types);
  PushTypes(except_sig);
  return result;
}